

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# redundancy_elimination.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::RedundancyEliminationPass::EliminateRedundanciesFrom
          (RedundancyEliminationPass *this,DominatorTreeNode *bb,ValueNumberTable *vnTable,
          map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
          *value_to_ids)

{
  pointer ppDVar1;
  DominatorTreeNode *bb_00;
  bool bVar2;
  bool bVar3;
  pointer ppDVar4;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  local_60;
  
  bVar2 = LocalRedundancyEliminationPass::EliminateRedundanciesInBB
                    (&this->super_LocalRedundancyEliminationPass,bb->bb_,vnTable,value_to_ids);
  ppDVar4 = (bb->children_).
            super__Vector_base<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppDVar1 = (bb->children_).
            super__Vector_base<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppDVar4 != ppDVar1) {
    do {
      bb_00 = *ppDVar4;
      std::
      _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
      ::_Rb_tree(&local_60,&value_to_ids->_M_t);
      bVar3 = EliminateRedundanciesFrom
                        (this,bb_00,vnTable,
                         (map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                          *)&local_60);
      bVar2 = (bool)(bVar2 | bVar3);
      std::
      _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
      ::_M_erase(&local_60,(_Link_type)local_60._M_impl.super__Rb_tree_header._M_header._M_parent);
      ppDVar4 = ppDVar4 + 1;
    } while (ppDVar4 != ppDVar1);
  }
  return bVar2;
}

Assistant:

bool RedundancyEliminationPass::EliminateRedundanciesFrom(
    DominatorTreeNode* bb, const ValueNumberTable& vnTable,
    std::map<uint32_t, uint32_t> value_to_ids) {
  bool modified = EliminateRedundanciesInBB(bb->bb_, vnTable, &value_to_ids);

  for (auto dominated_bb : bb->children_) {
    modified |= EliminateRedundanciesFrom(dominated_bb, vnTable, value_to_ids);
  }

  return modified;
}